

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::HlslParseContext::remapEntryPointIO
          (HlslParseContext *this,TFunction *function,TVariable **returnValue,
          TVector<glslang::TVariable_*> *inputs,TVector<glslang::TVariable_*> *outputs)

{
  ulong *puVar1;
  _Rb_tree_header *p_Var2;
  EShLanguage EVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TVariable *pTVar7;
  TType *pTVar8;
  TArraySizes *this_00;
  HlslParseContext *this_01;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  iterator iVar9;
  _Base_ptr this_02;
  TTypeList *pTVar10;
  TType *this_03;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  mapped_type *pmVar11;
  long lVar12;
  pointer pTVar13;
  _Base_ptr p_Var14;
  int i;
  uint uVar15;
  TType *pTVar16;
  anon_class_8_1_8991fb9c makeIoVariable;
  TType outputType;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  makeIoVariable.this = this;
  iVar6 = (*(function->super_TSymbol)._vptr_TSymbol[0xc])(function);
  iVar6 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar6) + 0x38))
                    ((long *)CONCAT44(extraout_var,iVar6));
  if (iVar6 == 0) {
    *returnValue = (TVariable *)0x0;
  }
  else {
    EVar3 = (this->super_TParseContextBase).super_TParseVersions.language;
    iVar6 = (*(function->super_TSymbol)._vptr_TSymbol[0xd])(function);
    pTVar7 = remapEntryPointIO::anon_class_8_1_8991fb9c::operator()
                       (&makeIoVariable,"@entryPointOutput",(TType *)CONCAT44(extraout_var_00,iVar6)
                        ,EvqVaryingOut);
    *returnValue = pTVar7;
    if (EVar3 == EShLangTessControl) {
      TType::TType(&outputType,EbtVoid,EvqTemporary,1,0,0,false);
      iVar6 = (*(function->super_TSymbol)._vptr_TSymbol[0xc])(function);
      pTVar8 = (TType *)CONCAT44(extraout_var_01,iVar6);
      TType::shallowCopy(&outputType,pTVar8);
      this_00 = (TArraySizes *)TArraySizes::operator_new((TArraySizes *)0x18,(size_t)pTVar8);
      (this_00->sizes)._vptr_TSmallArrayVector = (_func_int **)&PTR__TSmallArrayVector_00a5b8c8;
      (this_00->sizes).sizes = (TVector<glslang::TArraySize> *)0x0;
      this_00->implicitArraySize = 0;
      this_00->implicitlySized = true;
      this_00->variablyIndexed = false;
      TArraySizes::addInnerSize
                (this_00,((this->super_TParseContextBase).super_TParseVersions.intermediate)->
                         vertices);
      outputType.arraySizes = this_00;
      iVar6 = (*(function->super_TSymbol)._vptr_TSymbol[0xd])(function);
      this_01 = (HlslParseContext *)CONCAT44(extraout_var_02,iVar6);
      iVar6 = (*(this_01->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[10])();
      clearUniformInputOutput(this_01,(TQualifier *)CONCAT44(extraout_var_03,iVar6));
      pTVar7 = remapEntryPointIO::anon_class_8_1_8991fb9c::operator()
                         (&makeIoVariable,"@entryPointOutput",&outputType,EvqVaryingOut);
      *returnValue = pTVar7;
    }
  }
  p_Var2 = &(this->ioTypeMap).
            super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  uVar15 = 0;
  while( true ) {
    iVar6 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
    if (iVar6 <= (int)uVar15) break;
    pTVar16 = (TType *)(ulong)uVar15;
    iVar6 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function);
    pTVar8 = *(TType **)(CONCAT44(extraout_var_04,iVar6) + 8);
    iVar6 = (*pTVar8->_vptr_TType[10])(pTVar8);
    uVar4 = *(uint *)(CONCAT44(extraout_var_05,iVar6) + 8);
    if (((uVar4 & 0x7f) < 0x14) && ((0xd0000U >> (uVar4 & 0x1f) & 1) != 0)) {
      if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangFragment) {
        bVar5 = remapEntryPointIO::anon_class_8_1_8991fb9c::operator()::anon_class_1_0_00000001::
                operator()((anon_class_1_0_00000001 *)pTVar8,pTVar16);
        if (bVar5) {
          iVar6 = (*pTVar8->_vptr_TType[0x25])(pTVar8);
          if ((char)iVar6 == '\0') {
            iVar6 = (*pTVar8->_vptr_TType[10])(pTVar8);
            puVar1 = (ulong *)(CONCAT44(extraout_var_06,iVar6) + 8);
            *puVar1 = *puVar1 & 0xfffff01f1fffffff;
            iVar6 = (*pTVar8->_vptr_TType[10])(pTVar8);
            puVar1 = (ulong *)(CONCAT44(extraout_var_07,iVar6) + 8);
            *puVar1 = *puVar1 | 0x80000000;
          }
          else {
            outputType._vptr_TType = (_func_int **)TType::getStruct(pTVar8);
            pTVar16 = &outputType;
            iVar9 = std::
                    _Rb_tree<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>,_std::_Select1st<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                    ::find((_Rb_tree<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>,_std::_Select1st<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                            *)&this->ioTypeMap,(key_type *)pTVar16);
            if (((_Rb_tree_header *)iVar9._M_node == p_Var2) ||
               (this_02 = iVar9._M_node[1]._M_parent, this_02 == (_Base_ptr)0x0)) {
              this_02 = (_Base_ptr)
                        TVector<glslang::TTypeLoc>::operator_new
                                  ((TVector<glslang::TTypeLoc> *)0x20,(size_t)pTVar16);
              TVector<glslang::TTypeLoc>::TVector((TVector<glslang::TTypeLoc> *)this_02);
              pTVar10 = TType::getStruct(pTVar8);
              pTVar13 = (pTVar10->
                        super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                        ).
                        super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              while( true ) {
                pTVar10 = TType::getStruct(pTVar8);
                if (pTVar13 ==
                    (pTVar10->
                    super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                    super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                    ._M_impl.super__Vector_impl_data._M_finish) break;
                this_03 = (TType *)TType::operator_new((TType *)0x98,(size_t)pTVar16);
                TType::TType(this_03,EbtVoid,EvqTemporary,1,0,0,false);
                TType::shallowCopy(this_03,pTVar13->type);
                outputType.qualifier._8_4_ = (pTVar13->loc).column;
                outputType.qualifier._12_4_ = *(undefined4 *)&(pTVar13->loc).field_0x14;
                outputType._8_8_ = (pTVar13->loc).name;
                outputType.qualifier.semanticName = *(char **)&(pTVar13->loc).string;
                pTVar16 = &outputType;
                outputType._vptr_TType = (_func_int **)this_03;
                std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                push_back((vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *)
                          this_02,(value_type *)pTVar16);
                pTVar13 = pTVar13 + 1;
              }
              if ((_Rb_tree_header *)iVar9._M_node == p_Var2) {
                outputType._vptr_TType = (_func_int **)TType::getStruct(pTVar8);
                pTVar16 = &outputType;
                pmVar11 = std::
                          map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                          ::operator[](&(this->ioTypeMap).
                                        super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                                       ,(key_type *)pTVar16);
                pmVar11->input = (TTypeList *)this_02;
                pmVar11->output = (TTypeList *)0x0;
                pmVar11->uniform = (TTypeList *)0x0;
              }
              else {
                iVar9._M_node[1]._M_parent = this_02;
              }
            }
            for (p_Var14 = this_02->_M_parent; p_Var14 != this_02->_M_left; p_Var14 = p_Var14 + 1) {
              bVar5 = remapEntryPointIO::anon_class_8_1_8991fb9c::operator()::
                      anon_class_1_0_00000001::operator()
                                (*(anon_class_1_0_00000001 **)p_Var14,pTVar16);
              if (bVar5) {
                lVar12 = (**(code **)(**(long **)p_Var14 + 0x50))();
                *(ulong *)(lVar12 + 8) = *(ulong *)(lVar12 + 8) & 0xfffff01f1fffffff;
                lVar12 = (**(code **)(**(long **)p_Var14 + 0x50))();
                *(ulong *)(lVar12 + 8) = *(ulong *)(lVar12 + 8) | 0x80000000;
              }
            }
          }
        }
      }
      iVar6 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,(ulong)uVar15);
      outputType._vptr_TType =
           (_func_int **)
           remapEntryPointIO::anon_class_8_1_8991fb9c::operator()
                     (&makeIoVariable,*(char **)(*(long *)CONCAT44(extraout_var_08,iVar6) + 8),
                      pTVar8,EvqVaryingIn);
      std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>::push_back
                (&inputs->
                  super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                 ,(value_type *)&outputType);
    }
    iVar6 = (*pTVar8->_vptr_TType[10])(pTVar8);
    if ((*(uint *)(CONCAT44(extraout_var_09,iVar6) + 8) & 0x7f) - 0x11 < 2) {
      iVar6 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,(ulong)uVar15);
      outputType._vptr_TType =
           (_func_int **)
           remapEntryPointIO::anon_class_8_1_8991fb9c::operator()
                     (&makeIoVariable,*(char **)(*(long *)CONCAT44(extraout_var_10,iVar6) + 8),
                      pTVar8,EvqVaryingOut);
      std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>::push_back
                (&outputs->
                  super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                 ,(value_type *)&outputType);
    }
    uVar15 = uVar15 + 1;
  }
  return;
}

Assistant:

void HlslParseContext::remapEntryPointIO(TFunction& function, TVariable*& returnValue,
    TVector<TVariable*>& inputs, TVector<TVariable*>& outputs)
{
    // We might have in input structure type with no decorations that caused it
    // to look like an input type, yet it has (e.g.) interpolation types that
    // must be modified that turn it into an input type.
    // Hence, a missing ioTypeMap for 'input' might need to be synthesized.
    const auto synthesizeEditedInput = [this](TType& type) {
        // True if a type needs to be 'flat'
        const auto needsFlat = [](const TType& type) {
            return type.containsBasicType(EbtInt) ||
                    type.containsBasicType(EbtUint) ||
                    type.containsBasicType(EbtInt64) ||
                    type.containsBasicType(EbtUint64) ||
                    type.containsBasicType(EbtBool) ||
                    type.containsBasicType(EbtDouble);
        };

        if (language == EShLangFragment && needsFlat(type)) {
            if (type.isStruct()) {
                TTypeList* finalList = nullptr;
                auto it = ioTypeMap.find(type.getStruct());
                if (it == ioTypeMap.end() || it->second.input == nullptr) {
                    // Getting here means we have no input struct, but we need one.
                    auto list = new TTypeList;
                    for (auto member = type.getStruct()->begin(); member != type.getStruct()->end(); ++member) {
                        TType* newType = new TType;
                        newType->shallowCopy(*member->type);
                        TTypeLoc typeLoc = { newType, member->loc };
                        list->push_back(typeLoc);
                    }
                    // install the new input type
                    if (it == ioTypeMap.end()) {
                        tIoKinds newLists = { list, nullptr, nullptr };
                        ioTypeMap[type.getStruct()] = newLists;
                    } else
                        it->second.input = list;
                    finalList = list;
                } else
                    finalList = it->second.input;
                // edit for 'flat'
                for (auto member = finalList->begin(); member != finalList->end(); ++member) {
                    if (needsFlat(*member->type)) {
                        member->type->getQualifier().clearInterpolation();
                        member->type->getQualifier().flat = true;
                    }
                }
            } else {
                type.getQualifier().clearInterpolation();
                type.getQualifier().flat = true;
            }
        }
    };

    // Do the actual work to make a type be a shader input or output variable,
    // and clear the original to be non-IO (for use as a normal function parameter/return).
    const auto makeIoVariable = [this](const char* name, TType& type, TStorageQualifier storage) -> TVariable* {
        TVariable* ioVariable = makeInternalVariable(name, type);
        clearUniformInputOutput(type.getQualifier());
        if (type.isStruct()) {
            auto newLists = ioTypeMap.find(ioVariable->getType().getStruct());
            if (newLists != ioTypeMap.end()) {
                if (storage == EvqVaryingIn && newLists->second.input)
                    ioVariable->getWritableType().setStruct(newLists->second.input);
                else if (storage == EvqVaryingOut && newLists->second.output)
                    ioVariable->getWritableType().setStruct(newLists->second.output);
            }
        }
        if (storage == EvqVaryingIn) {
            correctInput(ioVariable->getWritableType().getQualifier());
            if (language == EShLangTessEvaluation)
                if (!ioVariable->getType().isArray())
                    ioVariable->getWritableType().getQualifier().patch = true;
        } else {
            correctOutput(ioVariable->getWritableType().getQualifier());
        }
        ioVariable->getWritableType().getQualifier().storage = storage;

        fixBuiltInIoType(ioVariable->getWritableType());

        return ioVariable;
    };

    // return value is actually a shader-scoped output (out)
    if (function.getType().getBasicType() == EbtVoid) {
        returnValue = nullptr;
    } else {
        if (language == EShLangTessControl) {
            // tessellation evaluation in HLSL writes a per-ctrl-pt value, but it needs to be an
            // array in SPIR-V semantics.  We'll write to it indexed by invocation ID.

            returnValue = makeIoVariable("@entryPointOutput", function.getWritableType(), EvqVaryingOut);

            TType outputType;
            outputType.shallowCopy(function.getType());

            // vertices has necessarily already been set when handling entry point attributes.
            TArraySizes* arraySizes = new TArraySizes;
            arraySizes->addInnerSize(intermediate.getVertices());
            outputType.transferArraySizes(arraySizes);

            clearUniformInputOutput(function.getWritableType().getQualifier());
            returnValue = makeIoVariable("@entryPointOutput", outputType, EvqVaryingOut);
        } else {
            returnValue = makeIoVariable("@entryPointOutput", function.getWritableType(), EvqVaryingOut);
        }
    }

    // parameters are actually shader-scoped inputs and outputs (in or out)
    for (int i = 0; i < function.getParamCount(); i++) {
        TType& paramType = *function[i].type;
        if (paramType.getQualifier().isParamInput()) {
            synthesizeEditedInput(paramType);
            TVariable* argAsGlobal = makeIoVariable(function[i].name->c_str(), paramType, EvqVaryingIn);
            inputs.push_back(argAsGlobal);
        }
        if (paramType.getQualifier().isParamOutput()) {
            TVariable* argAsGlobal = makeIoVariable(function[i].name->c_str(), paramType, EvqVaryingOut);
            outputs.push_back(argAsGlobal);
        }
    }
}